

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

void read_bdirect64(uchar *infile,LONGLONG *a,int n,int nqx,int nqy,uchar *scratch,int bit)

{
  int in_ECX;
  int in_EDX;
  LONGLONG *in_RSI;
  uchar *in_RDI;
  int in_R8D;
  uchar *in_R9;
  int in_stack_00000008;
  
  input_nnybble(in_RDI,(int)((ulong)in_RSI >> 0x20),(uchar *)CONCAT44(in_EDX,in_ECX));
  qtree_bitins64(in_R9,in_ECX,in_R8D,in_RSI,in_EDX,in_stack_00000008);
  return;
}

Assistant:

static void
read_bdirect64(unsigned char *infile, LONGLONG a[], int n, int nqx, int nqy, unsigned char scratch[], int bit)
{
	/*
	 * read bit image packed 4 pixels/nybble
	 */
/*
int i;
	for (i = 0; i < ((nqx+1)/2) * ((nqy+1)/2); i++) {
		scratch[i] = input_nybble(infile);
	}
*/
        input_nnybble(infile, ((nqx+1)/2) * ((nqy+1)/2), scratch);

	/*
	 * insert in bitplane BIT of image A
	 */
	qtree_bitins64(scratch,nqx,nqy,a,n,bit);
}